

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

GCstr * lj_str_rehash_chain(lua_State *L,StrHash hashc,char *str,MSize len)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong *puVar4;
  ulong *puVar5;
  StrHash SVar6;
  ulong uVar7;
  GCstr *pGVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  
  puVar2 = (undefined8 *)(L->glref).ptr64;
  bVar11 = 0;
  if (*(char *)((long)puVar2 + 0x21) == '\x03') {
    bVar11 = *(byte *)(puVar2 + 4) ^ 3;
  }
  lVar3 = puVar2[0x13];
  uVar1 = *(uint *)(puVar2 + 0x14);
  uVar10 = (ulong)(hashc & uVar1);
  puVar4 = *(ulong **)(lVar3 + uVar10 * 8);
  *(undefined8 *)(lVar3 + uVar10 * 8) = 1;
  *(undefined1 *)((long)puVar2 + 0xad) = 1;
joined_r0x00110e2d:
  do {
    if (puVar4 == (ulong *)0x0) {
      pGVar8 = lj_str_new(L,str,(ulong)len);
      return pGVar8;
    }
    puVar5 = (ulong *)*puVar4;
    if (bVar11 != 0) {
      if ((bVar11 & ((byte)puVar4[1] ^ 3)) == 0) {
        *(int *)((long)puVar2 + 0xa4) = *(int *)((long)puVar2 + 0xa4) + -1;
        lVar9 = (ulong)((*(uint *)((long)puVar4 + 0x14) & 0xfffffffc) + 4) + 0x18;
        puVar2[2] = puVar2[2] - lVar9;
        (*(code *)*puVar2)(puVar2[1],puVar4,lVar9,0);
        puVar4 = puVar5;
        goto joined_r0x00110e2d;
      }
      *(byte *)(puVar4 + 1) = *(byte *)(puVar2 + 4) & 3 | (byte)puVar4[1] & 0xf8;
    }
    SVar6 = (StrHash)puVar4[2];
    if (*(char *)((long)puVar4 + 0xb) == '\0') {
      SVar6 = (*hash_dense)(puVar2[0x16],SVar6,(char *)(puVar4 + 3),*(MSize *)((long)puVar4 + 0x14))
      ;
      *(StrHash *)(puVar4 + 2) = SVar6;
      *(undefined1 *)((long)puVar4 + 0xb) = 1;
    }
    uVar7 = (ulong)(SVar6 & uVar1);
    uVar10 = *(ulong *)(lVar3 + uVar7 * 8);
    *puVar4 = uVar10 & 0xfffffffffffffffe;
    *(ulong *)(lVar3 + uVar7 * 8) = (ulong)((uint)uVar10 & 1) | (ulong)puVar4;
    puVar4 = puVar5;
  } while( true );
}

Assistant:

static LJ_NOINLINE GCstr *lj_str_rehash_chain(lua_State *L, StrHash hashc,
					      const char *str, MSize len)
{
  global_State *g = G(L);
  int ow = g->gc.state == GCSsweepstring ? otherwhite(g) : 0;  /* Sweeping? */
  GCRef *strtab = g->str.tab;
  MSize strmask = g->str.mask;
  GCobj *o = gcref(strtab[hashc & strmask]);
  setgcrefp(strtab[hashc & strmask], (void *)((uintptr_t)1));
  g->str.second = 1;
  while (o) {
    uintptr_t u;
    GCobj *next = gcnext(o);
    GCstr *s = gco2str(o);
    StrHash hash;
    if (ow) {  /* Must sweep while rechaining. */
      if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* String alive? */
	lj_assertG(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED),
		   "sweep of undead string");
	makewhite(g, o);
      } else {  /* Free dead string. */
	lj_assertG(isdead(g, o) || ow == LJ_GC_SFIXED,
		   "sweep of unlive string");
	lj_str_free(g, s);
	o = next;
	continue;
      }
    }
    hash = s->hash;
    if (!s->hashalg) {  /* Rehash with secondary hash. */
      hash = hash_dense(g->str.seed, hash, strdata(s), s->len);
      s->hash = hash;
      s->hashalg = 1;
    }
    /* Rechain. */
    hash &= strmask;
    u = gcrefu(strtab[hash]);
    setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
    setgcrefp(strtab[hash], ((uintptr_t)o | (u & 1)));
    o = next;
  }
  /* Try to insert the pending string again. */
  return lj_str_new(L, str, len);
}